

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx512fp16.cpp
# Opt level: O0

void ncnn::cast_fp32_to_fp16_sse_avx512fp16(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Option *in_stack_000001d0;
  Mat *in_stack_000001d8;
  Mat *in_stack_000001e0;
  
  cast_fp32_to_fp16_sse(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  return;
}

Assistant:

void cast_fp32_to_fp16_sse_avx512fp16(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_fp32_to_fp16_sse(bottom_blob, top_blob, opt);
}